

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_JP2K.cpp
# Opt level: O0

void __thiscall ASDCP::JP2K::MXFSReader::~MXFSReader(MXFSReader *this)

{
  byte bVar1;
  h__SReader *phVar2;
  TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter> *this_00;
  MXFSReader *this_local;
  
  this->_vptr_MXFSReader = (_func_int **)&PTR__MXFSReader_0033ce10;
  phVar2 = ASDCP::mem_ptr::operator_cast_to_h__SReader_((mem_ptr *)&this->m_Reader);
  if (phVar2 != (h__SReader *)0x0) {
    phVar2 = mem_ptr<ASDCP::JP2K::MXFSReader::h__SReader>::operator->(&this->m_Reader);
    bVar1 = (**(code **)(*(long *)(phVar2->super_lh__Reader).super_h__ASDCPReader.
                                  super_TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>
                                  .m_File + 0x40))();
    if ((bVar1 & 1) != 0) {
      this_00 = (TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter> *)
                mem_ptr<ASDCP::JP2K::MXFSReader::h__SReader>::operator->(&this->m_Reader);
      MXF::TrackFileReader<ASDCP::MXF::OP1aHeader,_ASDCP::MXF::OPAtomIndexFooter>::Close(this_00);
    }
  }
  mem_ptr<ASDCP::JP2K::MXFSReader::h__SReader>::~mem_ptr(&this->m_Reader);
  return;
}

Assistant:

ASDCP::JP2K::MXFSReader::~MXFSReader()
{
  if ( m_Reader && m_Reader->m_File->IsOpen() )
    m_Reader->Close();
}